

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O3

bool __thiscall Clasp::mt::ParallelHandler::isModel(ParallelHandler *this,Solver *s)

{
  __int_type _Var1;
  size_type sVar2;
  bool bVar3;
  
  _Var1 = (this->ctrl_->shared_->modCount).super___atomic_base<unsigned_int>._M_i;
  if (_Var1 != (this->gp_).modCount) {
    bVar3 = Enumerator::update((Enumerator *)
                               ((this->ctrl_->super_SolveAlgorithm).enum_.ptr_ & 0xfffffffffffffffe)
                               ,s);
    if (!bVar3) {
      return false;
    }
    (this->gp_).modCount = _Var1;
  }
  sVar2 = (s->assign_).trail.ebo_.size;
  if ((s->assign_).assign_.ebo_.size != (s->assign_).elims_ + sVar2 + 1) {
    return false;
  }
  return sVar2 == (s->assign_).front;
}

Assistant:

bool ParallelHandler::isModel(Solver& s) {
	assert(s.numFreeVars() == 0);
	// either no unprocessed updates or still a model after
	// updates were integrated
	return ctrl_->integrateModels(s, gp_.modCount)
		&& s.numFreeVars() == 0
		&& s.queueSize()   == 0;
}